

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 05-channels.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  Slacking *pSVar2;
  ostream *poVar3;
  CategoryConversations *this;
  reference pCVar4;
  reference pvVar5;
  string *channel_id_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c0;
  string local_2b0 [8];
  string channel_id;
  Channel *channel;
  iterator __end1;
  iterator __begin1;
  vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *__range1;
  vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> channels;
  istream local_238 [8];
  ifstream infile;
  string local_30 [8];
  string mytoken;
  
  std::__cxx11::string::string(local_30);
  std::ifstream::ifstream(local_238,"token.txt",8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_238,local_30);
  slack::_detail::create((string *)local_30,true);
  pSVar2 = slack::_detail::instance();
  slack::_detail::CategoryConversations::list_abi_cxx11_
            ((CategoryConversations *)
             &channels.
              super__Vector_base<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(bool)((char)pSVar2 + -0x10));
  poVar3 = nlohmann::operator<<
                     ((ostream *)&std::cout,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&channels.
                          super__Vector_base<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&channels.
                    super__Vector_base<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this = slack::_detail::conversations();
  slack::_detail::CategoryConversations::list_magic
            ((vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)&__range1,
             this,false);
  poVar3 = slack::_detail::operator<<
                     ((ostream *)&std::cout,
                      (vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)
                      &__range1);
  std::operator<<(poVar3,'\n');
  __end1 = std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>::begin
                     ((vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)
                      &__range1);
  channel = (Channel *)
            std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>::end
                      ((vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)
                       &__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<slack::_detail::Channel_*,_std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>_>
                                *)&channel);
    if (!bVar1) break;
    pCVar4 = __gnu_cxx::
             __normal_iterator<slack::_detail::Channel_*,_std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>_>
             ::operator*(&__end1);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&pCVar4->name);
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<slack::_detail::Channel_*,_std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>_>
    ::operator++(&__end1);
  }
  pvVar5 = std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>::
           operator[]((vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)
                      &__range1,0);
  std::__cxx11::string::string(local_2b0,(string *)pvVar5);
  channel_id_00 = (string *)slack::_detail::conversations();
  slack::_detail::CategoryConversations::info((CategoryConversations *)&local_2c0,channel_id_00);
  poVar3 = nlohmann::operator<<((ostream *)&std::cout,&local_2c0);
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0);
  std::__cxx11::string::~string(local_2b0);
  std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>::~vector
            ((vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)&__range1)
  ;
  std::ifstream::~ifstream(local_238);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    // Load the token from a file. You can also specify directly the token in your code as a string.
    std::string mytoken;
    std::ifstream infile("token.txt");
    std::getline(infile, mytoken);

    slack::create(mytoken);
    
    // You can display all the JSON response
    std::cout << slack::instance().conversations.list() << std::endl; 

    // You can display filtered informations
    auto channels = slack::conversations().list_magic();
    std::cout << channels << '\n';

    // Iterate on channels
    for (auto const& channel : channels) {
        std::cout << channel.name << std::endl;
    }

    // Get precise informations on a specific channel
    auto channel_id = channels[0].id;
    std::cout << slack::conversations().info(channel_id) << std::endl;
}